

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::computeMinMaxValues
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,double side,double val,double minRes,
          double maxRes,double *minVal,double *maxVal)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  double *pdVar3;
  Real RVar4;
  double dVar5;
  double local_58;
  
  *minVal = 0.0;
  *maxVal = 0.0;
  pTVar1 = (this->super_SPxSimplifier<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->super_SPxSimplifier<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar4 = Tolerances::epsilon(pTVar1);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (-RVar4 <= val) {
    pTVar1 = (this->super_SPxSimplifier<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (this->super_SPxSimplifier<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    RVar4 = Tolerances::epsilon(pTVar1);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (val <= RVar4) {
      return;
    }
    ::soplex::infinity::__tls_init();
    pdVar3 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_58 = *pdVar3;
    if (local_58 <= maxRes) {
      ::soplex::infinity::__tls_init();
      dVar5 = -local_58;
    }
    else {
      dVar5 = (side - maxRes) / val;
    }
    *minVal = dVar5;
    ::soplex::infinity::__tls_init();
    if (-local_58 < minRes) goto LAB_00225ab8;
  }
  else {
    ::soplex::infinity::__tls_init();
    pdVar3 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_58 = *pdVar3;
    dVar5 = -local_58;
    if (minRes <= dVar5) {
      ::soplex::infinity::__tls_init();
    }
    else {
      dVar5 = (side - minRes) / val;
    }
    *minVal = dVar5;
    ::soplex::infinity::__tls_init();
    minRes = maxRes;
    if (maxRes < local_58) {
LAB_00225ab8:
      local_58 = (side - minRes) / val;
      goto LAB_00225acc;
    }
  }
  ::soplex::infinity::__tls_init();
LAB_00225acc:
  *maxVal = local_58;
  return;
}

Assistant:

void SPxMainSM<R>::computeMinMaxValues(SPxLPBase<R>& lp, R side, R val, R minRes, R maxRes,
                                       R& minVal, R& maxVal)
{
   minVal = 0;
   maxVal = 0;

   if(LT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(minRes <= R(-infinity))
         minVal = R(-infinity);
      else
         minVal = (side - minRes) / val;

      if(maxRes >= R(infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - maxRes) / val;
   }
   else if(GT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(maxRes >= R(infinity))
         minVal = R(-infinity);
      else
         minVal = (side - maxRes) / val;

      if(minRes <= R(-infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - minRes) / val;
   }
}